

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaJsonWriter::ContinueString(VmaJsonWriter *this,uint32_t n)

{
  VmaStringBuilder *this_00;
  bool bVar1;
  byte *pStr;
  byte local_2 [2];
  
  this_00 = this->m_SB;
  pStr = local_2 + 1;
  local_2[1] = 0;
  do {
    pStr[-1] = (char)n + (char)(n / 10) * -10 | 0x30;
    pStr = pStr + -1;
    bVar1 = 9 < n;
    n = n / 10;
  } while (bVar1);
  VmaStringBuilder::Add(this_00,(char *)pStr);
  return;
}

Assistant:

void VmaJsonWriter::ContinueString(uint32_t n)
{
    VMA_ASSERT(m_InsideString);
    m_SB.AddNumber(n);
}